

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

void update_mv_component_stats(int comp,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  byte val;
  uint uVar1;
  int iVar2;
  char in_DL;
  aom_cdf_prob *in_RSI;
  int in_EDI;
  aom_cdf_prob *hp_cdf;
  aom_cdf_prob *fp_cdf;
  int i;
  int n;
  int hp;
  int fr;
  int d;
  int mv_class;
  int mag;
  int sign;
  int offset;
  int *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  aom_cdf_prob *cdf;
  aom_cdf_prob *local_58;
  int local_38;
  int local_18;
  
  val = av1_get_mv_class((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98);
  uVar1 = (uint)val;
  iVar2 = local_18 >> 3;
  update_cdf(in_RSI + 0x1b,in_EDI < 0,2);
  update_cdf(in_RSI,val,0xb);
  if (uVar1 == 0) {
    update_cdf(in_RSI + 0x24,(int8_t)iVar2,2);
  }
  else {
    for (local_38 = 0; local_38 < (int)uVar1; local_38 = local_38 + 1) {
      update_cdf(in_RSI + (long)local_38 * 3 + 0x27,(byte)(iVar2 >> ((byte)local_38 & 0x1f)) & 1,2);
    }
  }
  if (-1 < in_DL) {
    if (uVar1 == 0) {
      local_58 = in_RSI + (long)iVar2 * 5 + 0xc;
    }
    else {
      local_58 = in_RSI + 0x16;
    }
    update_cdf(local_58,(byte)(local_18 >> 1) & 3,4);
  }
  if ('\0' < in_DL) {
    if (uVar1 == 0) {
      cdf = in_RSI + 0x1e;
    }
    else {
      cdf = in_RSI + 0x21;
    }
    update_cdf(cdf,(byte)local_18 & 1,2);
  }
  return;
}

Assistant:

static void update_mv_component_stats(int comp, nmv_component *mvcomp,
                                      MvSubpelPrecision precision) {
  assert(comp != 0);
  int offset;
  const int sign = comp < 0;
  const int mag = sign ? -comp : comp;
  const int mv_class = av1_get_mv_class(mag - 1, &offset);
  const int d = offset >> 3;         // int mv data
  const int fr = (offset >> 1) & 3;  // fractional mv data
  const int hp = offset & 1;         // high precision mv data

  // Sign
  update_cdf(mvcomp->sign_cdf, sign, 2);

  // Class
  update_cdf(mvcomp->classes_cdf, mv_class, MV_CLASSES);

  // Integer bits
  if (mv_class == MV_CLASS_0) {
    update_cdf(mvcomp->class0_cdf, d, CLASS0_SIZE);
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (int i = 0; i < n; ++i)
      update_cdf(mvcomp->bits_cdf[i], (d >> i) & 1, 2);
  }
  // Fractional bits
  if (precision > MV_SUBPEL_NONE) {
    aom_cdf_prob *fp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf;
    update_cdf(fp_cdf, fr, MV_FP_SIZE);
  }

  // High precision bit
  if (precision > MV_SUBPEL_LOW_PRECISION) {
    aom_cdf_prob *hp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf;
    update_cdf(hp_cdf, hp, 2);
  }
}